

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_format(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  char *__s;
  char *pcVar6;
  char *pcVar7;
  char *s;
  size_t l;
  void *p;
  lua_Number n_1;
  lua_Integer n;
  char *pcStack_498;
  int nb;
  char *buff;
  char local_488 [2];
  char local_486;
  uint maxitem;
  char form [32];
  undefined1 local_460 [8];
  luaL_Buffer b;
  char *flags;
  char *strfrmt_end;
  char *strfrmt;
  size_t sfl;
  int arg;
  int top;
  lua_State *L_local;
  
  _arg = L;
  sfl._4_4_ = lua_gettop(L);
  sfl._0_4_ = 1;
  pcVar2 = luaL_checklstring(_arg,1,(size_t *)&strfrmt);
  luaL_buffinit(_arg,(luaL_Buffer *)local_460);
  strfrmt_end = pcVar2;
  do {
    while( true ) {
      while( true ) {
        if (pcVar2 + (long)strfrmt <= strfrmt_end) {
          luaL_pushresult((luaL_Buffer *)local_460);
          return 1;
        }
        if (*strfrmt_end == '%') break;
        if (b.b <= b.size) {
          luaL_prepbuffsize((luaL_Buffer *)local_460,1);
        }
        *(char *)((long)local_460 + b.size) = *strfrmt_end;
        b.size = b.size + 1;
        strfrmt_end = strfrmt_end + 1;
      }
      pcVar7 = strfrmt_end + 1;
      if (strfrmt_end[1] != '%') break;
      if (b.b <= b.size) {
        luaL_prepbuffsize((luaL_Buffer *)local_460,1);
      }
      strfrmt_end = strfrmt_end + 2;
      *(char *)((long)local_460 + b.size) = *pcVar7;
      b.size = b.size + 1;
    }
    buff._4_4_ = 0x78;
    pcStack_498 = luaL_prepbuffsize((luaL_Buffer *)local_460,0x78);
    n._4_4_ = 0;
    sfl._0_4_ = (int)sfl + 1;
    if (sfl._4_4_ < (int)sfl) {
      iVar1 = luaL_argerror(_arg,(int)sfl,"no value");
      return iVar1;
    }
    pcVar7 = getformat(_arg,pcVar7,local_488);
    strfrmt_end = pcVar7 + 1;
    switch(*pcVar7) {
    case 'A':
    case 'a':
      checkformat(_arg,local_488,"-+#0 ",1);
      addlenmod(local_488,"");
      pcVar7 = pcStack_498;
      uVar3 = (ulong)buff._4_4_;
      luaL_checknumber(_arg,(int)sfl);
      n._4_4_ = snprintf(pcVar7,uVar3,local_488);
      break;
    default:
      iVar1 = luaL_error(_arg,"invalid conversion \'%s\' to \'format\'",local_488);
      return iVar1;
    case 'X':
    case 'o':
    case 'x':
      b.init._1016_8_ = anon_var_dwarf_19989;
      goto LAB_0012471f;
    case 'c':
      checkformat(_arg,local_488,"-",0);
      pcVar7 = pcStack_498;
      uVar3 = (ulong)buff._4_4_;
      uVar4 = luaL_checkinteger(_arg,(int)sfl);
      n._4_4_ = snprintf(pcVar7,uVar3,local_488,uVar4 & 0xffffffff);
      break;
    case 'd':
    case 'i':
      b.init._1016_8_ = anon_var_dwarf_19967;
      goto LAB_0012471f;
    case 'f':
      buff._4_4_ = 0x1a2;
      pcStack_498 = luaL_prepbuffsize((luaL_Buffer *)local_460,0x1a2);
    case 'E':
    case 'G':
    case 'e':
    case 'g':
      p = (void *)luaL_checknumber(_arg,(int)sfl);
      checkformat(_arg,local_488,"-+#0 ",1);
      addlenmod(local_488,"");
      n._4_4_ = snprintf(pcStack_498,(ulong)buff._4_4_,local_488,p);
      break;
    case 'p':
      l = (size_t)lua_topointer(_arg,(int)sfl);
      checkformat(_arg,local_488,"-",0);
      if (l == 0) {
        l = (size_t)anon_var_dwarf_11af7;
        sVar5 = strlen(local_488);
        local_488[sVar5 - 1] = 's';
      }
      n._4_4_ = snprintf(pcStack_498,(ulong)buff._4_4_,local_488,l);
      break;
    case 'q':
      if (local_486 != '\0') {
        iVar1 = luaL_error(_arg,"specifier \'%%q\' cannot have modifiers");
        return iVar1;
      }
      addliteral(_arg,(luaL_Buffer *)local_460,(int)sfl);
      break;
    case 's':
      __s = luaL_tolstring(_arg,(int)sfl,(size_t *)&s);
      pcVar7 = s;
      if (local_486 == '\0') {
        luaL_addvalue((luaL_Buffer *)local_460);
      }
      else {
        pcVar6 = (char *)strlen(__s);
        if (pcVar7 != pcVar6) {
          luaL_argerror(_arg,(int)sfl,"string contains zeros");
        }
        checkformat(_arg,local_488,"-",1);
        pcVar7 = strchr(local_488,0x2e);
        if ((pcVar7 == (char *)0x0) && ((char *)0x63 < s)) {
          luaL_addvalue((luaL_Buffer *)local_460);
        }
        else {
          n._4_4_ = snprintf(pcStack_498,(ulong)buff._4_4_,local_488,__s);
          lua_settop(_arg,-2);
        }
      }
      break;
    case 'u':
      b.init._1016_8_ = anon_var_dwarf_19972;
LAB_0012471f:
      n_1 = (lua_Number)luaL_checkinteger(_arg,(int)sfl);
      checkformat(_arg,local_488,(char *)b.init._1016_8_,1);
      addlenmod(local_488,"ll");
      n._4_4_ = snprintf(pcStack_498,(ulong)buff._4_4_,local_488,n_1);
    }
    b.size = n._4_4_ + b.size;
  } while( true );
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  const char *flags;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      unsigned maxitem = MAX_ITEM;  /* maximum length for the result */
      char *buff = luaL_prepbuffsize(&b, maxitem);  /* to put result */
      int nb = 0;  /* number of bytes in result */
      if (++arg > top)
        return luaL_argerror(L, arg, "no value");
      strfrmt = getformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          checkformat(L, form, L_FMTFLAGSC, 0);
          nb = l_sprintf(buff, maxitem, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
          flags = L_FMTFLAGSI;
          goto intcase;
        case 'u':
          flags = L_FMTFLAGSU;
          goto intcase;
        case 'o': case 'x': case 'X':
          flags = L_FMTFLAGSX;
         intcase: {
          lua_Integer n = luaL_checkinteger(L, arg);
          checkformat(L, form, flags, 1);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          checkformat(L, form, L_FMTFLAGSF, 1);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, maxitem, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'f':
          maxitem = MAX_ITEMF;  /* extra space for '%f' */
          buff = luaL_prepbuffsize(&b, maxitem);
          /* FALLTHROUGH */
        case 'e': case 'E': case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          checkformat(L, form, L_FMTFLAGSF, 1);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'p': {
          const void *p = lua_topointer(L, arg);
          checkformat(L, form, L_FMTFLAGSC, 0);
          if (p == NULL) {  /* avoid calling 'printf' with argument NULL */
            p = "(null)";  /* result */
            form[strlen(form) - 1] = 's';  /* format it as a string */
          }
          nb = l_sprintf(buff, maxitem, form, p);
          break;
        }
        case 'q': {
          if (form[2] != '\0')  /* modifiers? */
            return luaL_error(L, "specifier '%%q' cannot have modifiers");
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            checkformat(L, form, L_FMTFLAGSC, 1);
            if (strchr(form, '.') == NULL && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, maxitem, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid conversion '%s' to 'format'", form);
        }
      }
      lua_assert(cast_uint(nb) < maxitem);
      luaL_addsize(&b, cast_uint(nb));
    }
  }
  luaL_pushresult(&b);
  return 1;
}